

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

bool __thiscall
metaf::VisibilityGroup::appendVariableMeters
          (VisibilityGroup *this,string *group,IncompleteText next)

{
  _Storage<unsigned_int,_true> _Var1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  Distance *pDVar5;
  IncompleteText in_EDX;
  VisibilityGroup *in_RDI;
  optional<metaf::Distance> max;
  optional<metaf::Distance> min;
  smatch match;
  undefined6 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 in_stack_ffffffffffffff27;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this_00;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff50;
  flag_type in_stack_ffffffffffffff54;
  char *in_stack_ffffffffffffff58;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_ffffffffffffff60;
  string local_88 [52];
  undefined4 local_54;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_50;
  IncompleteText local_1c;
  byte local_1;
  
  local_1c = in_EDX;
  if ((appendVariableMeters(std::__cxx11::string_const&,metaf::VisibilityGroup::IncompleteText)::
       rgx_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&appendVariableMeters(std::__cxx11::string_const&,metaf::VisibilityGroup::IncompleteText)
                                   ::rgx_abi_cxx11_), iVar4 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &appendVariableMeters(std::__cxx11::string_const&,metaf::VisibilityGroup::IncompleteText)
                  ::rgx_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&appendVariableMeters(std::__cxx11::string_const&,metaf::VisibilityGroup::IncompleteText)
                         ::rgx_abi_cxx11_);
  }
  this_00 = &local_50;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)CONCAT17(in_stack_ffffffffffffff27,
                              CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
  bVar2 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (in_stack_ffffffffffffff40,
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)in_RDI,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                     CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                     (match_flag_type)((ulong)this_00 >> 0x20));
  if (bVar2) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(this_00,CONCAT17(in_stack_ffffffffffffff27,
                           CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
    Distance::fromMeterString
              ((string *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    std::__cxx11::string::~string(local_88);
    bVar2 = std::optional<metaf::Distance>::has_value((optional<metaf::Distance> *)0x2447fc);
    if (bVar2) {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(this_00,CONCAT17(in_stack_ffffffffffffff27,
                             CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
      Distance::fromMeterString
                ((string *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
      bVar2 = std::optional<metaf::Distance>::has_value((optional<metaf::Distance> *)0x244879);
      if (bVar2) {
        std::optional<metaf::Distance>::operator->((optional<metaf::Distance> *)0x2448c5);
        uVar3 = Distance::isReported
                          ((Distance *)
                           CONCAT17(in_stack_ffffffffffffff27,
                                    CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
        if ((bool)uVar3) {
          std::optional<metaf::Distance>::operator->((optional<metaf::Distance> *)0x2448e7);
          bVar2 = Distance::isReported
                            ((Distance *)
                             CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffff26,
                                                     in_stack_ffffffffffffff20)));
          if (bVar2) {
            pDVar5 = std::optional<metaf::Distance>::operator*
                               ((optional<metaf::Distance> *)0x244921);
            _Var1 = (pDVar5->dist).super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int>._M_payload;
            (in_RDI->vis).distModifier = pDVar5->distModifier;
            (in_RDI->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload = _Var1;
            *(undefined8 *)
             &(in_RDI->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_engaged =
                 *(undefined8 *)
                  &(pDVar5->dist).super__Optional_base<unsigned_int,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_int>._M_engaged;
            pDVar5 = std::optional<metaf::Distance>::operator*
                               ((optional<metaf::Distance> *)0x244942);
            _Var1 = (pDVar5->dist).super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int>._M_payload;
            (in_RDI->visMax).distModifier = pDVar5->distModifier;
            (in_RDI->visMax).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload = _Var1;
            *(undefined8 *)
             &(in_RDI->visMax).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_engaged =
                 *(undefined8 *)
                  &(pDVar5->dist).super__Optional_base<unsigned_int,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_int>._M_engaged;
            makeVariable(in_RDI);
            in_RDI->incompleteText = local_1c;
            local_1 = 1;
            goto LAB_0024497d;
          }
        }
        local_1 = 0;
      }
      else {
        local_1 = 0;
      }
    }
    else {
      local_1 = 0;
    }
  }
  else {
    local_1 = 0;
  }
LAB_0024497d:
  local_54 = 1;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)0x24498a);
  return (bool)(local_1 & 1);
}

Assistant:

bool VisibilityGroup::appendVariableMeters(const std::string & group, IncompleteText next) {
	static const std::regex rgx("(\\d\\d\\d\\d)V(\\d\\d\\d\\d)");
	static const auto matchMin = 1, matchMax = 2;
	std::smatch match;
	if (!std::regex_match(group, match, rgx)) return false;
	const auto min = Distance::fromMeterString(match.str(matchMin));
	if (!min.has_value()) return false;
	const auto max = Distance::fromMeterString(match.str(matchMax));
	if (!max.has_value()) return false;
	if (!min->isReported() || !max->isReported()) return false;
	vis = *min;
	visMax = *max;
	makeVariable();
	incompleteText = next;
	return true;
}